

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_php_struct(t_php_generator *this,t_struct *tstruct,bool is_exception)

{
  ofstream_with_content_based_conditional_update *this_00;
  int iVar1;
  undefined4 extraout_var;
  int __oflag;
  ofstream_with_content_based_conditional_update *poVar2;
  string f_struct_name;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->f_types_;
  if (this->classmap_ == false) {
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    std::operator+(&local_70,&this->package_dir_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar1));
    std::operator+(&local_50,&local_70,".php");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_70,local_50._M_dataplus._M_p,&local_71);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (this_00,(char *)&local_70,__oflag);
    std::__cxx11::string::~string((string *)&local_70);
    generate_program_header(this,(ostream *)this_00);
    std::__cxx11::string::~string((string *)&local_50);
  }
  poVar2 = this_00;
  generate_php_struct_definition(this,(ostream *)this_00,tstruct,is_exception,false);
  if (this->classmap_ == false) {
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (this_00,(int)poVar2);
  }
  return;
}

Assistant:

void t_php_generator::generate_php_struct(t_struct* tstruct, bool is_exception) {
  ofstream_with_content_based_conditional_update& f_struct = f_types_;
  if (!classmap_) {
    string f_struct_name = package_dir_ + tstruct->get_name() + ".php";
    f_struct.open(f_struct_name.c_str());
    generate_program_header(f_struct);
  }
  generate_php_struct_definition(f_struct, tstruct, is_exception);
  if (!classmap_) {
    f_struct.close();
  }
}